

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IDisk.cpp
# Opt level: O1

bool __thiscall IDisk::TrackFormatted(IDisk *this,MFMTrack *track_buffer)

{
  bool bVar1;
  Track track_info;
  Track local_28;
  
  if ((track_buffer == (MFMTrack *)0x0) || (track_buffer->size == 0)) {
    bVar1 = false;
  }
  else {
    local_28.list_sector_.super__Vector_base<IDisk::Sector,_std::allocator<IDisk::Sector>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_28.list_sector_.super__Vector_base<IDisk::Sector,_std::allocator<IDisk::Sector>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_28.list_sector_.super__Vector_base<IDisk::Sector,_std::allocator<IDisk::Sector>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    GetTrackInfo(this,track_buffer,&local_28);
    bVar1 = local_28.list_sector_.super__Vector_base<IDisk::Sector,_std::allocator<IDisk::Sector>_>.
            _M_impl.super__Vector_impl_data._M_finish !=
            local_28.list_sector_.super__Vector_base<IDisk::Sector,_std::allocator<IDisk::Sector>_>.
            _M_impl.super__Vector_impl_data._M_start;
    if (local_28.list_sector_.super__Vector_base<IDisk::Sector,_std::allocator<IDisk::Sector>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_28.list_sector_.
                      super__Vector_base<IDisk::Sector,_std::allocator<IDisk::Sector>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_28.list_sector_.
                            super__Vector_base<IDisk::Sector,_std::allocator<IDisk::Sector>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_28.list_sector_.
                            super__Vector_base<IDisk::Sector,_std::allocator<IDisk::Sector>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  }
  return bVar1;
}

Assistant:

bool IDisk::TrackFormatted(IDisk::MFMTrack* track_buffer)
{
   // If the pointer is null, it is not
   if (track_buffer == nullptr) return false;
   // If the size is 0, it is not
   if (track_buffer->size == 0) return false;

   // Search the track for any non-weak value
   Track track_info;
   GetTrackInfo(track_buffer, &track_info);
   return (track_info.list_sector_.size() > 0);
}